

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>::serialize
          (BasicTypeInfo<std::vector<dap::Scope,_std::allocator<dap::Scope>_>_> *this,Serializer *s,
          void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Serializer *s_local;
  BasicTypeInfo<std::vector<dap::Scope,_std::allocator<dap::Scope>_>_> *this_local;
  
  bVar1 = Serializer::serialize<dap::Scope>(s,(array<dap::Scope> *)ptr);
  return bVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }